

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O2

void __thiscall
Test_Template_ExpandWithCustomEmitter::Test_Template_ExpandWithCustomEmitter
          (Test_Template_ExpandWithCustomEmitter *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  std::vector<void(*)(),std::allocator<void(*)()>>::emplace_back<void(*)()>
            ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,&local_8);
  return;
}

Assistant:

TEST(Template, ExpandWithCustomEmitter) {
  Template* tpl = StringToTemplate("{{VAR}} {{VAR}}", STRIP_WHITESPACE);
  TemplateDictionary dict("test_expand");
  dict.SetValue("VAR", "this song is just six words long");
  string output;
  SizeofEmitter e(&output);
  ASSERT(tpl->Expand(&e, &dict));
  ASSERT_STREQ("XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX"
               "XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",
               output.c_str());
}